

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::writeField(Field<OpenMD::Vector3<double>_> *this)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  SnapshotManager *this_00;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  int *piVar10;
  double *pdVar11;
  RectMatrix<double,_3U,_3U> *pRVar12;
  StaticAnalyser *in_RDI;
  undefined4 uVar13;
  double dVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector3d voxelLoc;
  size_t i;
  size_t j;
  size_t k;
  Revision r;
  ofstream fs;
  Vector3d scaled;
  Mat3x3d hmat;
  Snapshot *in_stack_fffffffffffffbe8;
  ostream *in_stack_fffffffffffffbf0;
  Revision *in_stack_fffffffffffffc08;
  Vector<double,_3U> *v;
  RectMatrix<double,_3U,_3U> *m;
  Revision *in_stack_fffffffffffffc58;
  undefined1 local_360 [24];
  string local_348 [56];
  Vector3<double> local_310;
  RectMatrix<double,_3U,_3U> *local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  string local_2e0 [32];
  string local_2c0 [40];
  ostream local_298 [528];
  double local_88;
  Vector<double,_3U> local_80;
  Vector<double,_3U> local_68 [4];
  undefined1 auVar15 [16];
  
  this_00 = SimInfo::getSnapshotManager(in_RDI->info_);
  SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::getHmat(in_stack_fffffffffffffbe8);
  local_88 = 0.0;
  Vector<double,_3U>::Vector(&local_80,&local_88);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffbf0,
             (Vector<double,_3U> *)in_stack_fffffffffffffbe8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_298,pcVar4,_S_out);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) != 0) {
    poVar5 = std::operator<<(local_298,"# ");
    psVar6 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(local_298,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffffc58);
    poVar5 = std::operator<<(poVar5,local_2c0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_2c0);
    poVar5 = std::operator<<(local_298,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffc08);
    poVar5 = std::operator<<(poVar5,local_2e0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_2e0);
    poVar5 = std::operator<<(local_298,"# selection script: \"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[1].dumpFilename_);
    std::operator<<(poVar5,"\"\n");
    std::operator<<(local_298,"#\n");
    std::operator<<(local_298,"# Vector Field output file format has coordinates of the center\n");
    std::operator<<(local_298,"# of the voxel followed by the value of field (either vector or\n");
    std::operator<<(local_298,"# scalar).\n");
    local_2e8 = 0;
    while( true ) {
      uVar2 = local_2e8;
      pvVar7 = std::
               vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                             *)((long)&in_RDI[9].outputFilename_.field_2 + 8),0);
      pvVar8 = std::
               vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
               ::operator[](pvVar7,0);
      sVar9 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                        (pvVar8);
      if (sVar9 <= uVar2) break;
      auVar15._8_4_ = (int)(local_2e8 >> 0x20);
      auVar15._0_8_ = local_2e8;
      auVar15._12_4_ = 0x45300000;
      uVar13 = (undefined4)local_2e8;
      piVar10 = Vector3<int>::z((Vector3<int> *)((long)&in_RDI[9].dumpFilename_.field_2 + 8));
      iVar1 = *piVar10;
      pdVar11 = Vector3<double>::z((Vector3<double> *)local_68);
      *pdVar11 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) / (double)iVar1 - 0.5;
      local_2f0 = 0;
      while( true ) {
        uVar2 = local_2f0;
        pvVar7 = std::
                 vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                               *)((long)&in_RDI[9].outputFilename_.field_2 + 8),0);
        sVar9 = std::
                vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                ::size(pvVar7);
        if (sVar9 <= uVar2) break;
        auVar16._8_4_ = (int)(local_2f0 >> 0x20);
        auVar16._0_8_ = local_2f0;
        auVar16._12_4_ = 0x45300000;
        uVar13 = (undefined4)local_2f0;
        piVar10 = Vector3<int>::y((Vector3<int> *)((long)&in_RDI[9].dumpFilename_.field_2 + 8));
        iVar1 = *piVar10;
        pdVar11 = Vector3<double>::y((Vector3<double> *)local_68);
        *pdVar11 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) / (double)iVar1 - 0.5
        ;
        local_2f8 = (RectMatrix<double,_3U,_3U> *)0x0;
        while (m = local_2f8,
              pRVar12 = (RectMatrix<double,_3U,_3U> *)
                        std::
                        vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                        ::size((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                *)((long)&in_RDI[9].outputFilename_.field_2 + 8)), m < pRVar12) {
          auVar17._8_4_ = (int)(local_2f0 >> 0x20);
          auVar17._0_8_ = local_2f0;
          auVar17._12_4_ = 0x45300000;
          uVar13 = (undefined4)local_2f0;
          piVar10 = Vector3<int>::y((Vector3<int> *)((long)&in_RDI[9].dumpFilename_.field_2 + 8));
          dVar14 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) / (double)*piVar10 +
                   -0.5;
          v = local_68;
          pdVar11 = Vector3<double>::y((Vector3<double> *)v);
          *pdVar11 = dVar14;
          OpenMD::operator*(m,v);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffbf0,
                     (Vector<double,_3U> *)in_stack_fffffffffffffbe8);
          pdVar11 = Vector3<double>::x(&local_310);
          poVar5 = (ostream *)std::ostream::operator<<(local_298,*pdVar11);
          std::operator<<(poVar5,"\t");
          pdVar11 = Vector3<double>::y(&local_310);
          in_stack_fffffffffffffbf0 = (ostream *)std::ostream::operator<<(local_298,*pdVar11);
          std::operator<<(in_stack_fffffffffffffbf0,"\t");
          pdVar11 = Vector3<double>::z(&local_310);
          in_stack_fffffffffffffbe8 = (Snapshot *)std::ostream::operator<<(local_298,*pdVar11);
          std::operator<<((ostream *)in_stack_fffffffffffffbe8,"\t");
          pvVar7 = std::
                   vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                 *)((long)&in_RDI[9].outputFilename_.field_2 + 8),
                                (size_type)local_2f8);
          pvVar8 = std::
                   vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                   ::operator[](pvVar7,local_2f0);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](pvVar8,local_2e8);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffbf0,
                     (Vector3<double> *)in_stack_fffffffffffffbe8);
          (*in_RDI->_vptr_StaticAnalyser[8])(local_348,in_RDI,local_360);
          std::operator<<(local_298,local_348);
          std::__cxx11::string::~string(local_348);
          std::ostream::operator<<(local_298,std::endl<char,std::char_traits<char>>);
          local_2f8 = (RectMatrix<double,_3U,_3U> *)((long)local_2f8->data_[0] + 1);
        }
        local_2f0 = local_2f0 + 1;
      }
      local_2e8 = local_2e8 + 1;
    }
  }
  std::ofstream::~ofstream(local_298);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x178d07);
  return;
}

Assistant:

void Field<T>::writeField() {
    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d scaled(0.0);

    std::ofstream fs(outputFilename_.c_str());
    if (fs.is_open()) {
      Revision r;
      fs << "# " << getAnalysisType() << "\n";
      fs << "# OpenMD " << r.getFullRevision() << "\n";
      fs << "# " << r.getBuildDate() << "\n";
      fs << "# selection script: \"" << selectionScript_ << "\"\n";
      fs << "#\n";
      fs << "# Vector Field output file format has coordinates of the center\n";
      fs << "# of the voxel followed by the value of field (either vector or\n";
      fs << "# scalar).\n";

      for (std::size_t k = 0; k < field_[0][0].size(); ++k) {
        scaled.z() = RealType(k) / nBins_.z() - 0.5;
        for (std::size_t j = 0; j < field_[0].size(); ++j) {
          scaled.y() = RealType(j) / nBins_.y() - 0.5;
          for (std::size_t i = 0; i < field_.size(); ++i) {
            scaled.y() = RealType(j) / nBins_.y() - 0.5;

            Vector3d voxelLoc = hmat * scaled;

            fs << voxelLoc.x() << "\t";
            fs << voxelLoc.y() << "\t";
            fs << voxelLoc.z() << "\t";

            fs << writeValue(field_[i][j][k]);

            fs << std::endl;
          }
        }
      }
    }
  }